

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageTexelBuffer::submit
          (RenderVertexStorageTexelBuffer *this,SubmitContext *context)

{
  deUint64 dVar1;
  Context *this_00;
  DeviceInterface *pDVar2;
  VkCommandBuffer pVVar3;
  Handle<(vk::HandleType)18> *pHVar4;
  size_type sVar5;
  Handle<(vk::HandleType)16> *pHVar6;
  reference pvVar7;
  ulong local_70;
  ulong uStack_38;
  deUint32 count;
  size_t descriptorSetNdx;
  VkCommandBuffer commandBuffer;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  RenderVertexStorageTexelBuffer *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar2 = Context::getDeviceInterface(this_00);
  pVVar3 = SubmitContext::getCommandBuffer(context);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&this->m_resources);
  (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar3,0,pHVar4->m_internal);
  uStack_38 = 0;
  while( true ) {
    sVar5 = std::
            vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
            ::size(&this->m_descriptorSets);
    if (sVar5 <= uStack_38) break;
    if (this->m_bufferSize < (uStack_38 + 1) * (ulong)this->m_maxStorageTexelCount * 4) {
      local_70 = this->m_bufferSize + uStack_38 * this->m_maxStorageTexelCount * -4;
    }
    else {
      local_70 = (ulong)(this->m_maxStorageTexelCount << 2);
    }
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                       (&(this->m_resources).pipelineLayout.
                         super_RefBase<vk::Handle<(vk::HandleType)16>_>);
    dVar1 = pHVar6->m_internal;
    pvVar7 = std::
             vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
             ::operator[](&this->m_descriptorSets,uStack_38);
    (*pDVar2->_vptr_DeviceInterface[0x56])(pDVar2,pVVar3,0,dVar1,0,1,pvVar7,0,0);
    (*pDVar2->_vptr_DeviceInterface[0x59])
              (pDVar2,pVVar3,(ulong)((uint)(local_70 >> 1) & 0x7fffffff),1);
    uStack_38 = uStack_38 + 1;
  }
  return;
}

Assistant:

void RenderVertexStorageTexelBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();

	vkd.cmdBindPipeline(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipeline);

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const deUint32 count	= (deUint32)(m_bufferSize < (descriptorSetNdx + 1) * m_maxStorageTexelCount * 4
								? m_bufferSize - descriptorSetNdx * m_maxStorageTexelCount * 4
								: m_maxStorageTexelCount * 4) / 2;

		vkd.cmdBindDescriptorSets(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipelineLayout, 0u, 1u, &m_descriptorSets[descriptorSetNdx], 0u, DE_NULL);
		vkd.cmdDraw(commandBuffer, count, 1, 0, 0);
	}
}